

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

void __thiscall
flatbuffers::dart::DartGenerator::GenReader
          (DartGenerator *this,StructDef *struct_def,string *reader_name,string *code)

{
  string struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_58,&this->namer_,struct_def);
  std::operator+(&local_78,"class ",reader_name);
  std::operator+(&local_98,&local_78," extends ");
  std::operator+(&bStack_b8,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::append((char *)code);
  std::operator+(&bStack_b8,&local_58,"> {\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::operator+(&local_98,"  const ",reader_name);
  std::operator+(&bStack_b8,&local_98,"();\n\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&local_98);
  if (struct_def->fixed == true) {
    std::__cxx11::string::append((char *)code);
    NumToString<unsigned_long>(&local_78,struct_def->bytesize);
    std::operator+(&local_98,"  int get size => ",&local_78);
    std::operator+(&bStack_b8,&local_98,";\n\n");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&bStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::append((char *)code);
  std::operator+(&local_38,"  ",&local_58);
  std::operator+(&local_78,&local_38," createObject(fb.BufferContext bc, int offset) => \n    ");
  std::operator+(&local_98,&local_78,&local_58);
  std::operator+(&bStack_b8,&local_98,"._(bc, offset);\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void GenReader(const StructDef &struct_def, const std::string &reader_name,
                 std::string &code) {
    const auto struct_type = namer_.Type(struct_def);

    code += "class " + reader_name + " extends " + _kFb;
    if (struct_def.fixed) {
      code += ".StructReader<";
    } else {
      code += ".TableReader<";
    }
    code += struct_type + "> {\n";
    code += "  const " + reader_name + "();\n\n";

    if (struct_def.fixed) {
      code += "  @override\n";
      code += "  int get size => " + NumToString(struct_def.bytesize) + ";\n\n";
    }
    code += "  @override\n";
    code += "  " + struct_type +
            " createObject(fb.BufferContext bc, int offset) => \n    " +
            struct_type + "._(bc, offset);\n";
    code += "}\n\n";
  }